

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

void Gia_ManFindDerive(Gia_Man_t *pNew,int nOuts,Vec_Int_t *vIns,Vec_Wec_t *vCofs,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  word *pOut;
  Gia_Obj_t *pObj;
  word wVar6;
  Vec_Int_t *p_04;
  int *pCtrl;
  Vec_Int_t *vLevel;
  int Cof;
  int nBits;
  int Value;
  int k;
  int i;
  int nValues;
  word *pTruth;
  int nWords;
  Vec_Int_t *vData;
  Vec_Int_t *vBits;
  Vec_Int_t *vUsed;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vMemory;
  Vec_Int_t *vMap_local;
  Vec_Wec_t *vCofs_local;
  Vec_Int_t *vIns_local;
  int nOuts_local;
  Gia_Man_t *pNew_local;
  
  p = Vec_IntAlloc(0x10000);
  p_00 = Vec_IntAlloc(100);
  iVar1 = Vec_WecSize(vCofs);
  p_01 = Vec_IntStart(iVar1);
  p_02 = Vec_IntAlloc(10);
  iVar1 = Vec_WecSize(vCofs);
  p_03 = Vec_IntAlloc(iVar1);
  iVar1 = Vec_IntSize(vIns);
  iVar1 = Abc_TtWordNum(iVar1);
  pOut = (word *)malloc((long)iVar1 << 3);
  iVar2 = Vec_IntFindMax(vMap);
  iVar3 = Abc_Base2Log(iVar2 + 1U);
  iVar4 = Vec_IntSize(vIns);
  if (iVar4 <= iVar3) {
    __assert_fail("nBits < Vec_IntSize(vIns)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x44c,
                  "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
    ;
  }
  iVar4 = Vec_IntSize(vMap);
  iVar5 = Vec_WecSize(vCofs);
  if (iVar4 != iVar5) {
    __assert_fail("Vec_IntSize(vMap) == Vec_WecSize(vCofs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x44d,
                  "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
    ;
  }
  iVar4 = Vec_IntSize(vMap);
  iVar5 = Vec_IntSize(vIns);
  if (iVar4 != 1 << ((byte)iVar5 & 0x1f)) {
    __assert_fail("Vec_IntSize(vMap) == (1 << Vec_IntSize(vIns))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x44e,
                  "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
    ;
  }
  for (Value = 0; iVar4 = Vec_IntSize(vIns), Value < iVar4; Value = Value + 1) {
    iVar4 = Vec_IntEntry(vIns,Value);
    pObj = Gia_ManCi(pNew,iVar4);
    iVar4 = Gia_ObjToLit(pNew,pObj);
    Vec_IntPush(p_00,iVar4);
  }
  for (Value = 0; Value < iVar3; Value = Value + 1) {
    Abc_TtClear(pOut,iVar1);
    for (nBits = 0; iVar4 = Vec_IntSize(vMap), nBits < iVar4; nBits = nBits + 1) {
      iVar4 = Vec_IntEntry(vMap,nBits);
      if ((iVar4 >> ((byte)Value & 0x1f) & 1U) != 0) {
        Abc_TtSetBit(pOut,nBits);
      }
    }
    if (iVar3 < 6) {
      wVar6 = *pOut;
      iVar4 = Vec_IntSize(vIns);
      wVar6 = Abc_Tt6Stretch(wVar6,iVar4);
      *pOut = wVar6;
    }
    iVar4 = Vec_IntSize(vIns);
    iVar4 = Kit_TruthToGia(pNew,(uint *)pOut,iVar4,p,p_00,1);
    Vec_IntPush(p_02,iVar4);
  }
  Value = 0;
  while( true ) {
    if ((int)(iVar2 + 1U) <= Value) {
      Value = 0;
      while( true ) {
        if (nOuts <= Value) {
          if (pOut != (word *)0x0) {
            free(pOut);
          }
          Vec_IntFree(p_01);
          Vec_IntFree(p_02);
          Vec_IntFree(p_03);
          Vec_IntFree(p_00);
          Vec_IntFree(p);
          return;
        }
        Vec_IntClear(p_03);
        for (nBits = 0; iVar1 = Vec_WecSize(vCofs), nBits < iVar1; nBits = nBits + 1) {
          p_04 = Vec_WecEntry(vCofs,nBits);
          iVar1 = Vec_IntEntry(p_01,nBits);
          if (iVar1 != 0) {
            iVar1 = Vec_IntEntry(p_04,Value);
            Vec_IntPush(p_03,iVar1);
          }
        }
        while( true ) {
          iVar1 = Vec_IntSize(p_03);
          if (1 << ((byte)iVar3 & 0x1f) <= iVar1) break;
          Vec_IntPush(p_03,0);
        }
        iVar1 = Vec_IntSize(p_03);
        if (iVar1 != 1 << ((byte)iVar3 & 0x1f)) break;
        iVar1 = Vec_IntSize(p_02);
        if (iVar1 != iVar3) {
          __assert_fail("Vec_IntSize(vBits) == nBits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                        ,0x46c,
                        "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)"
                       );
        }
        pCtrl = Vec_IntArray(p_02);
        iVar1 = Vec_IntSize(p_02);
        iVar1 = Gia_ManFindMuxTree_rec(pNew,pCtrl,iVar1,p_03,0);
        Gia_ManAppendCo(pNew,iVar1);
        Value = Value + 1;
      }
      __assert_fail("Vec_IntSize(vData) == (1 << nBits)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                    ,0x46b,
                    "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Vec_IntFind(vMap,Value);
    if ((iVar1 < 0) || (iVar4 = Vec_WecSize(vCofs), iVar4 <= iVar1)) break;
    Vec_IntWriteEntry(p_01,iVar1,1);
    Value = Value + 1;
  }
  __assert_fail("Cof >= 0 && Cof < Vec_WecSize(vCofs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                ,0x45f,
                "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManFindDerive( Gia_Man_t * pNew, int nOuts, Vec_Int_t * vIns, Vec_Wec_t * vCofs, Vec_Int_t * vMap )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves = Vec_IntAlloc( 100 );
    Vec_Int_t * vUsed = Vec_IntStart( Vec_WecSize(vCofs) );
    Vec_Int_t * vBits = Vec_IntAlloc( 10 );
    Vec_Int_t * vData = Vec_IntAlloc( Vec_WecSize(vCofs) );
    int nWords = Abc_TtWordNum(Vec_IntSize(vIns));
    word * pTruth = ABC_ALLOC( word, nWords );
    int nValues = Vec_IntFindMax(vMap)+1;
    int i, k, Value, nBits = Abc_Base2Log(nValues);
    assert( nBits < Vec_IntSize(vIns) );
    assert( Vec_IntSize(vMap) == Vec_WecSize(vCofs) );
    assert( Vec_IntSize(vMap) == (1 << Vec_IntSize(vIns)) );
    Vec_IntForEachEntry( vIns, Value, i )
        Vec_IntPush( vLeaves, Gia_ObjToLit(pNew, Gia_ManCi(pNew, Value)) );
    for ( i = 0; i < nBits; i++ )
    {
        Abc_TtClear( pTruth, nWords );
        Vec_IntForEachEntry( vMap, Value, k )
            if ( (Value >> i) & 1 )
                Abc_TtSetBit( pTruth, k );
        if ( nBits < 6 )
            pTruth[0] = Abc_Tt6Stretch( pTruth[0], Vec_IntSize(vIns) );
        Vec_IntPush( vBits, Kit_TruthToGia(pNew, (unsigned*)pTruth, Vec_IntSize(vIns), vMemory, vLeaves, 1) );
        //printf( "Bit %d : ", i ); Dau_DsdPrintFromTruth( pTruth, Vec_IntSize(vIns) );
    }
    for ( i = 0; i < nValues; i++ )
    {
        int Cof = Vec_IntFind(vMap, i);
        assert( Cof >= 0 && Cof < Vec_WecSize(vCofs) );
        Vec_IntWriteEntry( vUsed, Cof, 1 );
    }
    for ( i = 0; i < nOuts; i++ )
    {
        Vec_Int_t * vLevel;
        Vec_IntClear( vData );
        Vec_WecForEachLevel( vCofs, vLevel, k )
            if ( Vec_IntEntry(vUsed, k) )
                Vec_IntPush( vData, Vec_IntEntry(vLevel, i) );
        while ( Vec_IntSize(vData) < (1 << nBits) )
            Vec_IntPush( vData, 0 );
        assert( Vec_IntSize(vData) == (1 << nBits) );
        assert( Vec_IntSize(vBits) == nBits );
        Value = Gia_ManFindMuxTree_rec( pNew, Vec_IntArray(vBits), Vec_IntSize(vBits), vData, 0 );
        Gia_ManAppendCo( pNew, Value );
    }
    ABC_FREE( pTruth );
    Vec_IntFree( vUsed );
    Vec_IntFree( vBits );
    Vec_IntFree( vData );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vMemory );
}